

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsInputGetComplex(HelicsInput inp,double *real,double *imag,HelicsError *err)

{
  HelicsInput pvVar1;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a9319;
    }
    else {
      pvVar1 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar1 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a931b;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a9319:
  pvVar1 = (HelicsInput)0x0;
LAB_001a931b:
  if (pvVar1 != (HelicsInput)0x0) {
    helics::Input::getValue_impl<std::complex<double>>(*(Input **)((long)pvVar1 + 0x18));
    if (real != (double *)0x0) {
      *real = 0.0;
    }
    if (imag != (double *)0x0) {
      *imag = 0.0;
    }
  }
  return;
}

Assistant:

void helicsInputGetComplex(HelicsInput inp, double* real, double* imag, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        auto cval = inpObj->inputPtr->getValue<std::complex<double>>();
        if (real != nullptr) {
            *real = cval.real();
        }
        if (imag != nullptr) {
            *imag = cval.imag();
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}